

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.c
# Opt level: O0

void transfer_lights(level *oldlev,level *newlev,uint obj_id)

{
  ls_t *plVar1;
  boolean bVar2;
  bool bVar3;
  boolean transfer;
  light_source *curr;
  light_source **prev;
  uint obj_id_local;
  level *newlev_local;
  level *oldlev_local;
  
  if (newlev != oldlev) {
    curr = (light_source *)&oldlev->lev_lights;
    while (plVar1 = curr->next, plVar1 != (ls_t *)0x0) {
      if (plVar1->type == 0) {
        if (obj_id == 0) {
          bVar2 = obj_is_local((obj *)plVar1->id);
          bVar3 = bVar2 == '\0';
        }
        else {
          bVar3 = *(uint *)((long)plVar1->id + 0x18) == obj_id;
        }
      }
      else if (plVar1->type == 1) {
        if (obj_id == 0) {
          bVar3 = *(char *)((long)plVar1->id + 0x4f) < '\x01';
        }
        else {
          bVar3 = false;
        }
      }
      else {
        bVar3 = false;
      }
      if (bVar3) {
        curr->next = plVar1->next;
        plVar1->next = newlev->lev_lights;
        newlev->lev_lights = plVar1;
      }
      else {
        curr = curr->next;
      }
    }
  }
  return;
}

Assistant:

void transfer_lights(struct level *oldlev, struct level *newlev, unsigned int obj_id)
{
    light_source **prev, *curr;
    boolean transfer;

    if (newlev == oldlev)
	return;

    for (prev = &oldlev->lev_lights; (curr = *prev) != 0; ) {
	switch (curr->type) {
	    case LS_OBJECT:
		if (obj_id)
		    transfer = (((struct obj *)curr->id)->o_id == obj_id);
		else
		    transfer = !obj_is_local((struct obj *)curr->id);
		break;
	    case LS_MONSTER:
		if (obj_id)
		    transfer = FALSE;
		else
		    transfer = !mon_is_local((struct monst *)curr->id);
		break;
	    default:
		transfer = FALSE;
		break;
	}
	/* associate light sources with the new level */
	if (transfer) {
	    *prev = curr->next;
	    curr->next = newlev->lev_lights;
	    newlev->lev_lights = curr;
	} else {
	    prev = &(*prev)->next;
	}
    }
}